

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_aggsig_combine_signatures
              (secp256k1_context *ctx,secp256k1_aggsig_context *aggctx,uchar *sig64,
              secp256k1_aggsig_partial_signature *partial,size_t n_sigs)

{
  int iVar1;
  long in_RCX;
  uchar *in_RDX;
  long in_RSI;
  ulong in_R8;
  int overflow;
  secp256k1_scalar tmp;
  secp256k1_ge final;
  secp256k1_scalar s;
  size_t i;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  secp256k1_gej *in_stack_ffffffffffffff30;
  uchar *in_stack_ffffffffffffff38;
  secp256k1_scalar *in_stack_ffffffffffffff40;
  secp256k1_gej *in_stack_ffffffffffffff48;
  secp256k1_scalar *in_stack_ffffffffffffff50;
  secp256k1_scalar *in_stack_ffffffffffffff58;
  secp256k1_scalar *in_stack_ffffffffffffff60;
  secp256k1_gej *in_stack_ffffffffffffff78;
  secp256k1_ge *in_stack_ffffffffffffff80;
  secp256k1_scalar local_58;
  ulong local_38;
  ulong local_30;
  uchar *local_20;
  int local_4;
  
  if (in_RSI == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_ffffffffffffff30,
               (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    local_4 = 0;
  }
  else if (in_RDX == (uchar *)0x0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_ffffffffffffff30,
               (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    local_4 = 0;
  }
  else if (in_RCX == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_ffffffffffffff30,
               (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    local_4 = 0;
  }
  else if (in_R8 == *(ulong *)(in_RSI + 0x98)) {
    local_30 = in_R8;
    local_20 = in_RDX;
    secp256k1_scalar_set_int(&local_58,0);
    for (local_38 = 0; local_38 < local_30; local_38 = local_38 + 1) {
      secp256k1_scalar_set_b32
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                 (int *)in_stack_ffffffffffffff30);
      if (in_stack_ffffffffffffff2c != 0) {
        return 0;
      }
      secp256k1_scalar_add
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    }
    iVar1 = secp256k1_gej_has_quad_y_var(in_stack_ffffffffffffff48);
    if (iVar1 == 0) {
      secp256k1_gej_neg(in_stack_ffffffffffffff30,
                        (secp256k1_gej *)
                        CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    }
    secp256k1_ge_set_gej(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    secp256k1_fe_normalize_var((secp256k1_fe *)&stack0xffffffffffffff50);
    secp256k1_fe_get_b32(local_20,(secp256k1_fe *)&stack0xffffffffffffff50);
    secp256k1_scalar_get_b32(local_20 + 0x20,&local_58);
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int secp256k1_aggsig_combine_signatures(const secp256k1_context* ctx, secp256k1_aggsig_context* aggctx, unsigned char *sig64, const secp256k1_aggsig_partial_signature *partial, size_t n_sigs) {
    size_t i;
    secp256k1_scalar s;
    secp256k1_ge final;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(aggctx != NULL);
    ARG_CHECK(sig64 != NULL);
    ARG_CHECK(partial != NULL);
    (void) ctx;

    if (n_sigs != aggctx->n_sigs) {
        return 0;
    }

    secp256k1_scalar_set_int(&s, 0);
    for (i = 0; i < n_sigs; i++) {
        secp256k1_scalar tmp;
        int overflow;
        secp256k1_scalar_set_b32(&tmp, partial[i].data, &overflow);
        if (overflow) {
            return 0;
        }
        secp256k1_scalar_add(&s, &s, &tmp);
    }

    /* If we need to negate the public nonce, everyone will
     * have negated their secret nonces in the previous step. */
    if (!secp256k1_gej_has_quad_y_var(&aggctx->pubnonce_sum)) {
        secp256k1_gej_neg(&aggctx->pubnonce_sum, &aggctx->pubnonce_sum);
    }

    secp256k1_ge_set_gej(&final, &aggctx->pubnonce_sum);
    secp256k1_fe_normalize_var(&final.x);
    secp256k1_fe_get_b32(sig64, &final.x);
    secp256k1_scalar_get_b32(sig64 + 32, &s);
    return 1;
}